

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QAbstractTextDocumentLayout::Selection>::copyAppend
          (QGenericArrayOps<QAbstractTextDocumentLayout::Selection> *this,Selection *b,Selection *e)

{
  qsizetype *pqVar1;
  Selection *pSVar2;
  long lVar3;
  
  if ((b != e) && (b < e)) {
    pSVar2 = (this->super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>).size;
      QTextCursor::QTextCursor(&pSVar2[lVar3].cursor,&b->cursor);
      QTextFormat::QTextFormat
                (&pSVar2[lVar3].format.super_QTextFormat,&(b->format).super_QTextFormat);
      pqVar1 = &(this->super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>).size;
      *pqVar1 = *pqVar1 + 1;
      b = b + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }